

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

int run_test_fs_chown(void)

{
  uv_file file_00;
  int iVar1;
  uv_loop_t *puVar2;
  undefined1 local_1c8 [4];
  uv_file file;
  uv_fs_t req;
  int r;
  
  unlink("test_file");
  unlink("test_file_link");
  loop = uv_default_loop();
  req.bufsml[3].len._4_4_ =
       uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_1c8,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  if (req.bufsml[3].len._4_4_ < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x6ea,"r >= 0");
    abort();
  }
  if ((long)req.cb < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x6eb,"req.result >= 0");
    abort();
  }
  file_00 = (uv_file)req.cb;
  uv_fs_req_cleanup((uv_fs_t *)local_1c8);
  req.bufsml[3].len._4_4_ =
       uv_fs_chown((uv_loop_t *)0x0,(uv_fs_t *)local_1c8,"test_file",0xffffffff,0xffffffff,
                   (uv_fs_cb)0x0);
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x6f1,"r == 0");
    abort();
  }
  if (req.cb != (uv_fs_cb)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x6f2,"req.result == 0");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)local_1c8);
  req.bufsml[3].len._4_4_ =
       uv_fs_fchown((uv_loop_t *)0x0,(uv_fs_t *)local_1c8,file_00,0xffffffff,0xffffffff,
                    (uv_fs_cb)0x0);
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x6f7,"r == 0");
    abort();
  }
  if (req.cb != (uv_fs_cb)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x6f8,"req.result == 0");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)local_1c8);
  req.bufsml[3].len._4_4_ =
       uv_fs_chown(loop,(uv_fs_t *)local_1c8,"test_file",0xffffffff,0xffffffff,chown_cb);
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x6fd,"r == 0");
    abort();
  }
  uv_run(loop,UV_RUN_DEFAULT);
  if (chown_cb_count != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x6ff,"chown_cb_count == 1");
    abort();
  }
  chown_cb_count = 0;
  req.bufsml[3].len._4_4_ = uv_fs_chown(loop,(uv_fs_t *)local_1c8,"test_file",0,0,chown_root_cb);
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x705,"r == 0");
    abort();
  }
  uv_run(loop,UV_RUN_DEFAULT);
  if (chown_cb_count != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x707,"chown_cb_count == 1");
    abort();
  }
  req.bufsml[3].len._4_4_ =
       uv_fs_fchown(loop,(uv_fs_t *)local_1c8,file_00,0xffffffff,0xffffffff,fchown_cb);
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x70c,"r == 0");
    abort();
  }
  uv_run(loop,UV_RUN_DEFAULT);
  if (fchown_cb_count != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x70e,"fchown_cb_count == 1");
    abort();
  }
  req.bufsml[3].len._4_4_ =
       uv_fs_link((uv_loop_t *)0x0,(uv_fs_t *)local_1c8,"test_file","test_file_link",(uv_fs_cb)0x0);
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x714,"r == 0");
    abort();
  }
  if (req.cb != (uv_fs_cb)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x715,"req.result == 0");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)local_1c8);
  req.bufsml[3].len._4_4_ =
       uv_fs_lchown((uv_loop_t *)0x0,(uv_fs_t *)local_1c8,"test_file_link",0xffffffff,0xffffffff,
                    (uv_fs_cb)0x0);
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x71a,"r == 0");
    abort();
  }
  if (req.cb != (uv_fs_cb)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x71b,"req.result == 0");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)local_1c8);
  req.bufsml[3].len._4_4_ =
       uv_fs_lchown(loop,(uv_fs_t *)local_1c8,"test_file_link",0xffffffff,0xffffffff,lchown_cb);
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x720,"r == 0");
    abort();
  }
  uv_run(loop,UV_RUN_DEFAULT);
  if (lchown_cb_count != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x722,"lchown_cb_count == 1");
    abort();
  }
  req.bufsml[3].len._4_4_ = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)local_1c8,file_00,(uv_fs_cb)0x0)
  ;
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x727,"r == 0");
    abort();
  }
  if (req.cb != (uv_fs_cb)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x728,"req.result == 0");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)local_1c8);
  uv_run(loop,UV_RUN_DEFAULT);
  unlink("test_file");
  unlink("test_file_link");
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x735,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(fs_chown) {
  int r;
  uv_fs_t req;
  uv_file file;

  /* Setup. */
  unlink("test_file");
  unlink("test_file_link");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &req, "test_file", O_RDWR | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  file = req.result;
  uv_fs_req_cleanup(&req);

  /* sync chown */
  r = uv_fs_chown(NULL, &req, "test_file", -1, -1, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /* sync fchown */
  r = uv_fs_fchown(NULL, &req, file, -1, -1, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /* async chown */
  r = uv_fs_chown(loop, &req, "test_file", -1, -1, chown_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(chown_cb_count == 1);

#ifndef __MVS__
  /* chown to root (fail) */
  chown_cb_count = 0;
  r = uv_fs_chown(loop, &req, "test_file", 0, 0, chown_root_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(chown_cb_count == 1);
#endif

  /* async fchown */
  r = uv_fs_fchown(loop, &req, file, -1, -1, fchown_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(fchown_cb_count == 1);

#ifndef __HAIKU__
  /* Haiku doesn't support hardlink */
  /* sync link */
  r = uv_fs_link(NULL, &req, "test_file", "test_file_link", NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /* sync lchown */
  r = uv_fs_lchown(NULL, &req, "test_file_link", -1, -1, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /* async lchown */
  r = uv_fs_lchown(loop, &req, "test_file_link", -1, -1, lchown_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(lchown_cb_count == 1);
#endif

  /* Close file */
  r = uv_fs_close(NULL, &req, file, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /*
   * Run the loop just to check we don't have make any extraneous uv_ref()
   * calls. This should drop out immediately.
   */
  uv_run(loop, UV_RUN_DEFAULT);

  /* Cleanup. */
  unlink("test_file");
  unlink("test_file_link");

  MAKE_VALGRIND_HAPPY();
  return 0;
}